

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

void __thiscall QTabWidget::initStyleOption(QTabWidget *this,QStyleOptionTabWidgetFrame *option)

{
  QTabWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  QWidget *pQVar2;
  QTabBar *this_01;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  QStyle *pQVar7;
  ulong uVar8;
  ulong uVar9;
  QSize QVar10;
  QSize QVar11;
  ulong uVar12;
  QRect QVar13;
  
  if (option != (QStyleOptionTabWidgetFrame *)0x0) {
    this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
    QTabWidgetPrivate::initBasicStyleOption(this_00,option);
    pQVar7 = QWidget::style(&this->super_QWidget);
    uVar8 = 0;
    iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x16,0);
    uVar5 = QFrame::frameWidth(&this_00->stack->super_QFrame);
    uVar12 = (ulong)uVar5;
    bVar3 = QWidget::isVisibleTo(&this_00->tabs->super_QWidget,&this->super_QWidget);
    if (bVar3) {
      uVar8 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
      uVar12 = uVar8 >> 0x20;
      bVar3 = documentMode(this);
      if (bVar3) {
        pQVar1 = (this->super_QWidget).data;
        if ((*(uint *)(*(long *)&(this->super_QWidget).field_0x8 + 0x27c) & 0xfffffffe) == 2) {
          uVar12 = (ulong)(((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1);
        }
        else {
          uVar8 = (ulong)(((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1);
        }
      }
    }
    pQVar2 = this_00->rightCornerWidget;
    if ((pQVar2 == (QWidget *)0x0) || ((pQVar2->data->widget_attributes & 0x8000) == 0)) {
      QVar10.wd.m_i = 0;
      QVar10.ht.m_i = 0;
    }
    else {
      uVar9 = (**(code **)(*(long *)pQVar2 + 0x70))();
      uVar5 = (int)uVar12 - iVar4;
      uVar6 = (uint)(uVar9 >> 0x20);
      if ((int)uVar6 < (int)uVar5) {
        uVar5 = uVar6;
      }
      QVar10 = (QSize)(uVar9 & 0xffffffff | (ulong)uVar5 << 0x20);
    }
    option->rightCornerWidgetSize = QVar10;
    pQVar2 = this_00->leftCornerWidget;
    if ((pQVar2 == (QWidget *)0x0) || ((pQVar2->data->widget_attributes & 0x8000) == 0)) {
      QVar11.wd.m_i = 0;
      QVar11.ht.m_i = 0;
    }
    else {
      uVar9 = (**(code **)(*(long *)pQVar2 + 0x70))();
      uVar5 = (int)uVar12 - iVar4;
      uVar6 = (uint)(uVar9 >> 0x20);
      if ((int)uVar6 < (int)uVar5) {
        uVar5 = uVar6;
      }
      QVar11 = (QSize)(uVar9 & 0xffffffff | (ulong)uVar5 << 0x20);
    }
    option->leftCornerWidgetSize = QVar11;
    option->tabBarSize = (QSize)(uVar8 & 0xffffffff | uVar12 << 0x20);
    this_01 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    iVar4 = QTabBar::currentIndex(this_01);
    QVar13 = QTabBar::tabRect(this_01,iVar4);
    uVar8._0_4_ = (option->tabBarRect).x1;
    uVar8._4_4_ = (option->tabBarRect).y1;
    uVar12 = (uVar8 & 0xffffffff00000000) + QVar13._8_8_ & 0xffffffff00000000 |
             (ulong)(uint)(QVar13.x2.m_i.m_i + (undefined4)uVar8);
    uVar8 = (ulong)(uint)((undefined4)uVar8 + QVar13.x1.m_i.m_i) |
            QVar13._0_8_ + (uVar8 & 0xffffffff00000000) & 0xffffffff00000000;
    (option->selectedTabRect).x1 = (Representation)(int)uVar8;
    (option->selectedTabRect).y1 = (Representation)(int)(uVar8 >> 0x20);
    (option->selectedTabRect).x2 = (Representation)(int)uVar12;
    (option->selectedTabRect).y2 = (Representation)(int)(uVar12 >> 0x20);
  }
  return;
}

Assistant:

void QTabWidget::initStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    if (!option)
        return;

    Q_D(const QTabWidget);
    d->initBasicStyleOption(option);

    int exth = style()->pixelMetric(QStyle::PM_TabBarBaseHeight, nullptr, this);
    QSize t(0, d->stack->frameWidth());
    if (d->tabs->isVisibleTo(const_cast<QTabWidget *>(this))) {
        t = d->tabs->sizeHint();
        if (documentMode()) {
            if (tabPosition() == East || tabPosition() == West) {
                t.setHeight(height());
            } else {
                t.setWidth(width());
            }
        }
    }

    if (d->rightCornerWidget && d->rightCornerWidget->isVisible()) {
        const QSize rightCornerSizeHint = d->rightCornerWidget->sizeHint();
        const QSize bounds(rightCornerSizeHint.width(), t.height() - exth);
        option->rightCornerWidgetSize = rightCornerSizeHint.boundedTo(bounds);
    } else {
        option->rightCornerWidgetSize = QSize(0, 0);
    }

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible()) {
        const QSize leftCornerSizeHint = d->leftCornerWidget->sizeHint();
        const QSize bounds(leftCornerSizeHint.width(), t.height() - exth);
        option->leftCornerWidgetSize = leftCornerSizeHint.boundedTo(bounds);
    } else {
        option->leftCornerWidgetSize = QSize(0, 0);
    }

    option->tabBarSize = t;

    QRect selectedTabRect = tabBar()->tabRect(tabBar()->currentIndex());
    selectedTabRect.moveTopLeft(selectedTabRect.topLeft() + option->tabBarRect.topLeft());
    option->selectedTabRect = selectedTabRect;
}